

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureBufferCase.cpp
# Opt level: O3

IterateResult __thiscall deqp::gls::TextureBufferCase::iterate(TextureBufferCase *this)

{
  deUint32 dVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  size_t offset;
  deInt32 alignment;
  Random rng;
  
  dVar1 = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  uVar2 = (dVar1 >> 0x10 ^ dVar1 ^ 0x3d) * 9;
  uVar2 = (uVar2 >> 4 ^ uVar2) * 0x27d4eb2d;
  deRandom_init(&rng.m_rnd,uVar2 >> 0xf ^ uVar2);
  if (this->m_offset == 0) {
    offset = 0;
  }
  else {
    iVar3 = (*this->m_renderCtx->_vptr_RenderContext[3])();
    alignment = 0;
    (**(code **)(CONCAT44(extraout_var,iVar3) + 0x868))(0x919f,&alignment);
    dVar1 = (**(code **)(CONCAT44(extraout_var,iVar3) + 0x800))();
    glu::checkError(dVar1,"glGetIntegerv(GL_TEXTURE_BUFFER_OFFSET_ALIGNMENT)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureBufferCase.cpp"
                    ,0x407);
    offset = (long)alignment * this->m_offset;
  }
  anon_unknown_1::runTests
            ((this->super_TestCase).super_TestNode.m_testCtx,this->m_renderCtx,&rng,this->m_format,
             this->m_bufferSize,offset,this->m_size,this->m_preRender,this->m_preRenderProgram,
             this->m_modify,this->m_postRender,this->m_postRenderProgram);
  return STOP;
}

Assistant:

tcu::TestCase::IterateResult TextureBufferCase::iterate (void)
{
	de::Random	rng		(deInt32Hash(deStringHash(getName())));
	size_t		offset;

	if (m_offset != 0)
	{
		const glw::Functions&	gl			= m_renderCtx.getFunctions();
		deInt32					alignment	= 0;

		gl.getIntegerv(GL_TEXTURE_BUFFER_OFFSET_ALIGNMENT, &alignment);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv(GL_TEXTURE_BUFFER_OFFSET_ALIGNMENT)");

		offset = m_offset * alignment;
	}
	else
		offset = 0;

	runTests(m_testCtx, m_renderCtx, rng, m_format, m_bufferSize, offset, m_size, m_preRender, m_preRenderProgram, m_modify, m_postRender, m_postRenderProgram);

	return STOP;
}